

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ulong uVar4;
  string *__lhs;
  allocator<char> local_149;
  string local_148;
  cmValue local_128;
  cmValue fmt;
  cmValue sep;
  string sepVar;
  string ll;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  TVar3 = GetType(this);
  if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
     (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
    this_local._7_1_ = 0;
    goto LAB_00908a7a;
  }
  bVar2 = cmTarget::GetHaveInstallRule(this->Target);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00908a7a;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00908a7a;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
  bVar2 = GetPropertyAsBool(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00908a7a;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_NO_BUILTIN_CHRPATH",&local_a1);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_00908a7a;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_PLATFORM_HAS_INSTALLNAME",
             (allocator<char> *)(ll.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(ll.field_2._M_local_buf + 0xf));
  if (bVar2) {
    this_local._7_1_ = 1;
    goto LAB_00908a7a;
  }
  GetLinkerLanguage((string *)((long)&sepVar.field_2 + 8),this,local_20);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmStrCat<char_const(&)[30],std::__cxx11::string&,char_const(&)[10]>
              ((string *)&sep,(char (*) [30])"CMAKE_SHARED_LIBRARY_RUNTIME_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&sepVar.field_2 + 8),(char (*) [10])0x108923a);
    fmt = cmMakefile::GetDefinition(this->Makefile,(string *)&sep);
    bVar2 = cmNonempty(fmt);
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CMAKE_EXECUTABLE_FORMAT",&local_149);
      local_128 = cmMakefile::GetDefinition(pcVar1,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      bVar2 = cmValue::operator_cast_to_bool(&local_128);
      if (!bVar2) goto LAB_00908a1e;
      __lhs = cmValue::operator*[abi_cxx11_(&local_128);
      bVar2 = std::operator==(__lhs,"ELF");
      if (!bVar2) goto LAB_00908a1e;
      this_local._7_1_ = 1;
      bVar2 = true;
    }
    else {
LAB_00908a1e:
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&sep);
    if (!bVar2) goto LAB_00908a50;
  }
  else {
LAB_00908a50:
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)(sepVar.field_2._M_local_buf + 8));
LAB_00908a7a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::IsChrpathUsed(const std::string& config) const
{
  // Only certain target types have an rpath.
  if (!(this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->GetType() == cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // If the target will not be installed we do not need to change its
  // rpath.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // Skip chrpath if skipping rpath altogether.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // Skip chrpath if it does not need to be changed at install time.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // Allow the user to disable builtin chrpath explicitly.
  if (this->Makefile->IsOn("CMAKE_NO_BUILTIN_CHRPATH")) {
    return false;
  }

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return true;
  }

  // Enable if the rpath flag uses a separator and the target uses
  // binaries we know how to edit.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string sepVar =
      cmStrCat("CMAKE_SHARED_LIBRARY_RUNTIME_", ll, "_FLAG_SEP");
    cmValue sep = this->Makefile->GetDefinition(sepVar);
    if (cmNonempty(sep)) {
      // TODO: Add binary format check to ABI detection and get rid of
      // CMAKE_EXECUTABLE_FORMAT.
      if (cmValue fmt =
            this->Makefile->GetDefinition("CMAKE_EXECUTABLE_FORMAT")) {
        if (*fmt == "ELF") {
          return true;
        }
#if defined(CMake_USE_XCOFF_PARSER)
        if (*fmt == "XCOFF") {
          return true;
        }
#endif
      }
    }
  }
  return false;
}